

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::anon_unknown_0::AnsiPortListBuilder::AnsiPortListBuilder
          (AnsiPortListBuilder *this,Scope *scope,
          SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>
          *implicitMembers)

{
  Compilation *pCVar1;
  undefined8 in_RDX;
  Scope *in_RSI;
  undefined8 *in_RDI;
  
  pCVar1 = Scope::getCompilation(in_RSI);
  *in_RDI = pCVar1;
  in_RDI[1] = in_RSI;
  in_RDI[2] = in_RDX;
  *(undefined4 *)(in_RDI + 3) = 2;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 7));
  *(undefined1 *)(in_RDI + 9) = 0;
  return;
}

Assistant:

AnsiPortListBuilder(const Scope& scope,
                        SmallVectorBase<std::pair<Symbol*, const Symbol*>>& implicitMembers) :
        comp(scope.getCompilation()), scope(scope), implicitMembers(implicitMembers) {}